

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Args a;
  FastText fasttext;
  string local_200;
  Args local_1e0;
  FastText local_b8;
  
  ::fasttext::Args::Args(&local_1e0);
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(&local_1e0);
    exit(1);
  }
  ::fasttext::Args::parseArgs(&local_1e0,args);
  ::fasttext::FastText::FastText(&local_b8);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_1e0.output._M_dataplus._M_p,
             local_1e0.output._M_dataplus._M_p + local_1e0.output._M_string_length);
  std::__cxx11::string::append((char *)&local_200);
  ::fasttext::FastText::loadModel(&local_b8,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  ::fasttext::FastText::quantize(&local_b8,&local_1e0);
  std::operator+(&local_200,&local_1e0.output,".ftz");
  ::fasttext::FastText::saveModel(&local_b8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}